

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangleQuadrature.hpp
# Opt level: O2

RectMatrix<double,_3U,_3U> *
OpenMD::TriangleQuadrature<OpenMD::RectMatrix<double,_3U,_3U>,_double>::Integrate
          (RectMatrix<double,_3U,_3U> *__return_storage_ptr__,
          function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_3U>_&)> *f,
          TriangleQuadratureRule *rule,double *area)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/OpenMD[P]OpenMD/src/math/integration/TriangleQuadrature.hpp:94:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/OpenMD[P]OpenMD/src/math/integration/TriangleQuadrature.hpp:94:9)>
             ::_M_manager;
  local_28._M_unused._M_object = f;
  Integrate(__return_storage_ptr__,
            (function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *)
            &local_28,rule,area);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

NumericReturnType TriangleQuadrature<NumericReturnType, T>::Integrate(
      const std::function<NumericReturnType(const Vector<T, 3>&)>& f,
      const TriangleQuadratureRule& rule, const T& area) {
    // Create a function fprime accepting a 2D barycentric representation but
    // using it to call the given 3D function f.
    std::function<NumericReturnType(const Vector<T, 2>&)> fprime =
        [&f](const Vector<T, 2>& barycentric_2D) {
          return f(Vector3<T>(barycentric_2D[0], barycentric_2D[1],
                              T(1.0) - barycentric_2D[0] - barycentric_2D[1]));
        };

    return Integrate(fprime, rule, area);
  }